

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this)

{
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl = &PTR__TPZSavable_01778398;
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (&this->super_TPZMultiphysicsElement,&PTR_PTR_01775788);
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl =
       &PTR__TPZMultiphysicsCompEl_01775478;
  TPZManVector<TPZCompElSide,_5>::TPZManVector(&this->fElementVec,0);
  (this->fConnectIndexes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fConnectIndexes).fStore = (long *)0x0;
  (this->fConnectIndexes).fNElements = 0;
  (this->fConnectIndexes).fNAlloc = 0;
  TPZIntCube3D::TPZIntCube3D(&this->fIntRule,2);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl() : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(), fElementVec(0){
}